

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleContextMenuEvent(QWidgetWindow *this,QContextMenuEvent *e)

{
  bool bVar1;
  Reason RVar2;
  KeyboardModifiers KVar3;
  QPoint *pQVar4;
  QWidget *pQVar5;
  QContextMenuEvent *in_RSI;
  long in_FS_OFFSET;
  QWidget *receiver;
  QPoint globalPos;
  QPoint pos;
  QContextMenuEvent widgetEvent;
  undefined4 in_stack_ffffffffffffff20;
  QPoint *in_stack_ffffffffffffff28;
  QWidget *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QWidget *local_b8;
  QPoint local_78;
  QPoint local_70;
  QContextMenuEvent local_68 [64];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = QPointer<QWidget>::get((QPointer<QWidget> *)0x3b735c);
  local_70 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QContextMenuEvent::pos(in_RSI);
  local_70 = *pQVar4;
  local_78 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = QContextMenuEvent::globalPos(in_RSI);
  local_78 = *pQVar4;
  RVar2 = QContextMenuEvent::reason(in_RSI);
  if (RVar2 == Keyboard) {
    local_b8 = QWidget::keyboardGrabber();
    if (local_b8 == (QWidget *)0x0) {
      pQVar5 = QApplication::activePopupWidget();
      if (pQVar5 == (QWidget *)0x0) {
        pQVar5 = QApplication::focusWidget();
        if (pQVar5 == (QWidget *)0x0) {
          local_b8 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x3b742f);
        }
        else {
          local_b8 = QApplication::focusWidget();
        }
      }
      else {
        QApplication::activePopupWidget();
        pQVar5 = QWidget::focusWidget((QWidget *)0x3b73da);
        if (pQVar5 == (QWidget *)0x0) {
          in_stack_ffffffffffffff30 = QApplication::activePopupWidget();
          local_b8 = in_stack_ffffffffffffff30;
        }
        else {
          QApplication::activePopupWidget();
          in_stack_ffffffffffffff30 = QWidget::focusWidget((QWidget *)0x3b73ed);
          local_b8 = in_stack_ffffffffffffff30;
        }
      }
    }
    if (local_b8 != (QWidget *)0x0) {
      (**(code **)(*(long *)local_b8 + 400))(&local_28,local_b8,2);
      ::QVariant::toRect();
      local_70 = QRect::center((QRect *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ));
      ::QVariant::~QVariant(&local_28);
      local_78 = QWidget::mapToGlobal(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
  }
  else if (local_b8 != (QWidget *)0x0) {
    pQVar5 = local_b8;
    QContextMenuEvent::globalPos(in_RSI);
    local_70 = QWidget::mapFromGlobal(in_stack_ffffffffffffff30,(QPoint *)pQVar5);
  }
  if ((local_b8 != (QWidget *)0x0) && (bVar1 = QWidget::isEnabled((QWidget *)0x3b751e), bVar1)) {
    memset(local_68,0xaa,0x40);
    RVar2 = QContextMenuEvent::reason(in_RSI);
    KVar3 = QInputEvent::modifiers((QInputEvent *)CONCAT44(RVar2,in_stack_ffffffffffffff20));
    QContextMenuEvent::QContextMenuEvent
              (local_68,RVar2,(QPoint *)&local_70,(QPoint *)&local_78,
               (QFlags_conflict1 *)
               (ulong)(uint)KVar3.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                            super_QFlagsStorage<Qt::KeyboardModifier>.i);
    QCoreApplication::forwardEvent(&local_b8->super_QObject,(QEvent *)local_68,(QEvent *)in_RSI);
    QContextMenuEvent::~QContextMenuEvent(local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleContextMenuEvent(QContextMenuEvent *e)
{
    QWidget *receiver = qt_last_mouse_receiver.get();
    QPoint pos = e->pos();
    QPoint globalPos = e->globalPos();

    // Keyboard-originating context menu events are delivered to the focus widget,
    // independently of event position.
    if (e->reason() == QContextMenuEvent::Keyboard) {
        receiver = QWidget::keyboardGrabber();
        if (!receiver) {
            if (QApplication::activePopupWidget()) {
                receiver = (QApplication::activePopupWidget()->focusWidget()
                            ? QApplication::activePopupWidget()->focusWidget()
                            : QApplication::activePopupWidget());
            } else if (QApplication::focusWidget()) {
                receiver = QApplication::focusWidget();
            } else {
                receiver = m_widget;
            }
        }
        if (Q_LIKELY(receiver)) {
            pos = receiver->inputMethodQuery(Qt::ImCursorRectangle).toRect().center();
            globalPos = receiver->mapToGlobal(pos);
        }
    } else if (Q_LIKELY(receiver)) {
        pos = receiver->mapFromGlobal(e->globalPos());
    }

    if (receiver && receiver->isEnabled()) {
        QContextMenuEvent widgetEvent(e->reason(), pos, globalPos, e->modifiers());
        QGuiApplication::forwardEvent(receiver, &widgetEvent, e);
    }
}